

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::anon_unknown_0::WaitOnlyCase::init(WaitOnlyCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  int iVar1;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_190;
  
  local_190.m_log =
       ((this->super_FlushFinishCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log
  ;
  this_00 = &local_190.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::ostream::operator<<(this_00,0x4b0);
  std::operator<<((ostream *)this_00," ms busy wait");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  iVar1 = FlushFinishCase::init(&this->super_FlushFinishCase,ctx_00);
  return iVar1;
}

Assistant:

void init (void)
	{
		m_testCtx.getLog() << TestLog::Message << int(WAIT_TIME_MS) << " ms busy wait" << TestLog::EndMessage;
		FlushFinishCase::init();
	}